

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall
CVmObjBigNum::getp_format(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  int whole_places;
  int frac_digits;
  ulong flags;
  vm_val_t *lead_fill;
  uint uVar3;
  int iStack_50;
  
  if (argc == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *argc;
  }
  if ((getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    getp_format::desc.min_argc_ = 0;
    getp_format::desc.opt_argc_ = 6;
    getp_format::desc.varargs_ = 0;
    __cxa_guard_release(&getp_format(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_format::desc);
  if (iVar1 != 0) {
    return 1;
  }
  if ((int)uVar3 < 1) {
    iVar1 = -1;
  }
  else {
    iStack_50 = -1;
    whole_places = -1;
    iVar1 = CVmBif::pop_int_or_nil(-1);
    if (uVar3 != 1) {
      lead_fill = (vm_val_t *)0x0;
      uVar2 = CVmBif::pop_int_or_nil(0);
      flags = (ulong)uVar2;
      frac_digits = whole_places;
      if (2 < uVar3) {
        iStack_50 = -1;
        whole_places = CVmBif::pop_int_or_nil(-1);
        if (uVar3 == 3) {
          lead_fill = (vm_val_t *)0x0;
          frac_digits = -1;
        }
        else {
          iStack_50 = -1;
          frac_digits = CVmBif::pop_int_or_nil(-1);
          if ((uVar3 < 5) || (iStack_50 = CVmBif::pop_int_or_nil(-1), uVar3 == 5)) {
            lead_fill = (vm_val_t *)0x0;
          }
          else {
            lead_fill = sp_ + -1;
          }
        }
      }
      goto LAB_0022948f;
    }
  }
  iStack_50 = -1;
  whole_places = -1;
  flags = 0;
  lead_fill = (vm_val_t *)0x0;
  frac_digits = whole_places;
LAB_0022948f:
  cvt_to_string(self,retval,(this->super_CVmObject).ext_,iVar1,whole_places,frac_digits,iStack_50,
                flags,lead_fill);
  if (lead_fill != (vm_val_t *)0x0) {
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_format(VMG_ vm_obj_id_t self,
                              vm_val_t *retval, uint *argc)
{
    int orig_argc = (argc != 0 ? *argc : 0);
    int max_digits = -1;
    uint flags = 0;
    int whole_places = -1;
    int frac_digits = -1;
    int exp_digits = -1;
    vm_val_t *lead_fill = 0;
    static CVmNativeCodeDesc desc(0, 6);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the maximum digit count */
    if (orig_argc >= 1)
        max_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the flags */
    if (orig_argc >= 2)
        flags = CVmBif::pop_int_or_nil(vmg_ 0);

    /* get the whole places */
    if (orig_argc >= 3)
        whole_places = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the fraction digits */
    if (orig_argc >= 4)
        frac_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* get the exponent digits */
    if (orig_argc >= 5)
        exp_digits = CVmBif::pop_int_or_nil(vmg_ -1);

    /* 
     *   get the lead fill string if provided (leave it on the stack to
     *   protect against garbage collection) 
     */
    if (orig_argc >= 6)
        lead_fill = G_stk->get(0);

    /* format the number, which will build the return string */
    cvt_to_string(vmg_ self, retval, ext_, max_digits, whole_places,
                  frac_digits, exp_digits, flags, lead_fill);

    /* discard the lead fill string, if provided */
    if (lead_fill != 0)
        G_stk->discard();

    /* handled */
    return TRUE;
}